

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

string * OGNGetIcaoAcType_abi_cxx11_(FlarmAircraftTy _acTy)

{
  pointer pbVar1;
  reference pvVar2;
  pointer pbVar3;
  long lVar4;
  
  pvVar2 = std::
           array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
           ::at(&dataRefs.aFlarmToIcaoAcTy,(ulong)_acTy);
  pbVar3 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar1) {
    pbVar3 = &dataRefs.sDefaultAcIcaoType;
  }
  else {
    lVar4 = (long)pbVar1 - (long)pbVar3;
    if (lVar4 != 0x20) {
      lVar4 = randoml(0,(lVar4 >> 5) + -1);
      pbVar3 = (pvVar2->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar4;
    }
  }
  return pbVar3;
}

Assistant:

const std::string& OGNGetIcaoAcType (FlarmAircraftTy _acTy)
{
    try {
        const std::vector<std::string>& icaoTypes = dataRefs.aFlarmToIcaoAcTy.at(_acTy);
        if (icaoTypes.empty()) return dataRefs.GetDefaultAcIcaoType();
        if (icaoTypes.size() == 1) return icaoTypes.front();
        // more than one type defined, take a random pick
        const size_t i = (size_t)randoml(0, long(icaoTypes.size()) - 1);
        assert(0 <= i && i < icaoTypes.size());
        return icaoTypes[i];
    }
    catch (...) {
        return dataRefs.GetDefaultAcIcaoType();
    }
}